

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::setFromConstTriplets
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,Triplets *triplets)

{
  Triplets *in_RDI;
  Triplets copy;
  Triplets *in_stack_00000098;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *in_stack_000000a0;
  Triplets local_28;
  
  Triplets::Triplets(&local_28,in_RDI);
  setFromTriplets(in_stack_000000a0,in_stack_00000098);
  Triplets::~Triplets((Triplets *)0x778595);
  return;
}

Assistant:

void SparseMatrix<ordering>::setFromConstTriplets(const iDynTree::Triplets& triplets)
    {
        iDynTree::Triplets copy(triplets);
        setFromTriplets(copy);
    }